

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall boost::condition_error::condition_error(condition_error *this,int ev,char *what_arg)

{
  error_category *peVar1;
  error_code ec;
  
  ec._4_4_ = 0;
  ec.m_val = ev;
  peVar1 = system::generic_category();
  ec.m_cat = peVar1;
  system::system_error::system_error(&this->super_system_error,ec,what_arg);
  *(undefined ***)&this->super_system_error = &PTR__system_error_001e3ad8;
  return;
}

Assistant:

condition_error( int ev, const char * what_arg )
          : base_type(system::error_code(ev, system::generic_category()), what_arg)
          {
          }